

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O2

void slang::ast::addBlockMembers(GenerateBlockSymbol *block,SyntaxNode *syntax)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  long lVar3;
  
  if (syntax->kind == GenerateBlock) {
    pSVar1 = syntax[6].parent;
    pSVar2 = syntax[6].previewNode;
    for (lVar3 = 0; (long)pSVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
      Scope::addMembers(&block->super_Scope,*(SyntaxNode **)((long)&pSVar1->kind + lVar3));
    }
    return;
  }
  Scope::addMembers(&block->super_Scope,syntax);
  return;
}

Assistant:

static void addBlockMembers(GenerateBlockSymbol& block, const SyntaxNode& syntax) {
    if (syntax.kind != SyntaxKind::GenerateBlock) {
        block.addMembers(syntax);
    }
    else {
        for (auto member : syntax.as<GenerateBlockSyntax>().members)
            block.addMembers(*member);
    }
}